

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3BeginTrigger(Parse *pParse,Token *pName1,Token *pName2,int tr_tm,int op,IdList *pColumns
                        ,SrcList *pTableName,Expr *pWhen,int isTemp,int noErr)

{
  undefined1 *puVar1;
  byte bVar2;
  uchar uVar3;
  sqlite3 *db;
  Db *pDVar4;
  Schema *pSVar5;
  char *zArg3;
  Token *pName_00;
  uint iDb;
  int iVar6;
  int iVar7;
  Table *pTVar8;
  char *pcVar9;
  HashElem *pHVar10;
  Trigger *pTrigger;
  Expr *pEVar11;
  RenameToken *pRVar12;
  long lVar13;
  char *pcVar14;
  Schema **ppSVar15;
  uchar uVar16;
  char *zArg3_00;
  Token *pName;
  DbFixer sFix;
  Token *local_120;
  Parse *local_118;
  Walker local_110;
  Schema *local_e0;
  undefined1 local_d8;
  char *local_d0;
  char *local_c8;
  Token *local_c0;
  Select local_b8;
  
  db = pParse->db;
  if (isTemp == 0) {
    iDb = sqlite3TwoPartName(pParse,pName1,pName2,&local_120);
    if (pTableName != (SrcList *)0x0 && -1 < (int)iDb) {
LAB_0016873d:
      if (db->mallocFailed == '\0') {
        if ((iDb != 1) && ((db->init).busy != '\0')) {
          pcVar9 = pTableName->a[0].zDatabase;
          if (pcVar9 != (char *)0x0) {
            sqlite3DbFreeNN(db,pcVar9);
          }
          pTableName->a[0].zDatabase = (char *)0x0;
        }
        pTVar8 = sqlite3SrcListLookup(pParse,pTableName);
        pName_00 = local_120;
        if ((((db->init).busy == '\0') && (pTVar8 != (Table *)0x0 && pName2->n == 0)) &&
           (pTVar8->pSchema == db->aDb[1].pSchema)) {
          iDb = 1;
        }
        if (db->mallocFailed == '\0') {
          pDVar4 = pParse->db->aDb;
          local_d0 = pDVar4[iDb].zDbSName;
          local_e0 = pDVar4[iDb].pSchema;
          local_c8 = "trigger";
          local_c0 = local_120;
          local_d8 = iDb == 1;
          local_110.xExprCallback = fixExprCb;
          local_110.xSelectCallback = fixSelectCb;
          local_110.xSelectCallback2 = sqlite3WalkWinDefnDummyCallback;
          local_110.walkerDepth = 0;
          local_110.eCode = 0;
          local_110.u.pNC = (NameContext *)&local_118;
          local_b8.pEList = (ExprList *)0x0;
          local_b8.pWin = (Window *)0x0;
          local_b8.pWinDefn = (Window *)0x0;
          local_b8.pLimit = (Expr *)0x0;
          local_b8.pWith = (With *)0x0;
          local_b8.pPrior = (Select *)0x0;
          local_b8.pNext = (Select *)0x0;
          local_b8.pHaving = (Expr *)0x0;
          local_b8.pOrderBy = (ExprList *)0x0;
          local_b8.pWhere = (Expr *)0x0;
          local_b8.pGroupBy = (ExprList *)0x0;
          local_b8.selId = 0;
          local_b8.addrOpenEphm[0] = 0;
          local_b8.addrOpenEphm[1] = 0;
          local_b8._28_4_ = 0;
          local_b8.op = '\0';
          local_b8._1_1_ = 0;
          local_b8.nSelectRow = 0;
          local_b8.selFlags = 0;
          local_b8.iLimit = 0;
          local_b8.iOffset = 0;
          local_b8.pSrc = pTableName;
          local_118 = pParse;
          local_110.pParse = pParse;
          iVar6 = sqlite3WalkSelect(&local_110,&local_b8);
          if (iVar6 != 0) {
LAB_001688d6:
            pTrigger = (Trigger *)0x0;
            goto LAB_001687d0;
          }
          pTVar8 = sqlite3SrcListLookup(pParse,pTableName);
          if (pTVar8 == (Table *)0x0) {
            pcVar9 = (char *)0x0;
            goto LAB_00168937;
          }
          if (pTVar8->eTabType == '\x01') {
            pcVar14 = "cannot create triggers on virtual tables";
LAB_0016892a:
            pcVar9 = (char *)0x0;
            sqlite3ErrorMsg(pParse,pcVar14);
LAB_00168937:
            if ((db->init).iDb == '\x01') {
              puVar1 = &(db->init).field_0x6;
              *puVar1 = *puVar1 | 1;
            }
LAB_0016894c:
            if (pcVar9 != (char *)0x0) goto LAB_00168951;
          }
          else {
            if (((pTVar8->tabFlags & 0x1000) != 0) &&
               (iVar6 = sqlite3ReadOnlyShadowTables(db), iVar6 != 0)) {
              pcVar14 = "cannot create triggers on shadow tables";
              goto LAB_0016892a;
            }
            pcVar9 = sqlite3NameFromToken(db,pName_00);
            if (pcVar9 == (char *)0x0) goto LAB_001688d6;
            iVar6 = sqlite3CheckObjectName(pParse,pcVar9,"trigger",pTVar8->zName);
            if (iVar6 == 0) {
              bVar2 = pParse->eParseMode;
              if ((bVar2 < 2) &&
                 (pHVar10 = findElementWithHash(&(db->aDb[iDb].pSchema)->trigHash,pcVar9,(uint *)0x0
                                               ), pHVar10->data != (void *)0x0)) {
                if (noErr == 0) {
                  sqlite3ErrorMsg(pParse,"trigger %T already exists",pName_00);
                }
                else {
                  sqlite3CodeVerifySchema(pParse,iDb);
                }
                goto LAB_00168951;
              }
              pcVar14 = pTVar8->zName;
              if (pcVar14 != (char *)0x0) {
                lVar13 = 0;
                do {
                  if ((ulong)(byte)pcVar14[lVar13] == 0) {
                    uVar3 = ""[(byte)"sqlite_"[lVar13]];
                    uVar16 = '\0';
LAB_00168a4f:
                    if (uVar16 != uVar3) goto LAB_00168a72;
                    break;
                  }
                  uVar16 = ""[(byte)pcVar14[lVar13]];
                  uVar3 = ""[(byte)"sqlite_"[lVar13]];
                  if (uVar16 != uVar3) goto LAB_00168a4f;
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 7);
                sqlite3ErrorMsg(pParse,"cannot create trigger on system table");
                goto LAB_0016894c;
              }
LAB_00168a72:
              if (tr_tm != 0x41 && pTVar8->eTabType == '\x02') {
                pcVar14 = "AFTER";
                if (tr_tm == 0x21) {
                  pcVar14 = "BEFORE";
                }
                sqlite3ErrorMsg(pParse,"cannot create %s trigger on view: %S",pcVar14,pTableName->a)
                ;
                goto LAB_00168937;
              }
              if (tr_tm == 0x41 && pTVar8->eTabType != '\x02') {
                sqlite3ErrorMsg(pParse,"cannot create INSTEAD OF trigger on table: %S",pTableName->a
                               );
                goto LAB_00168937;
              }
              if (bVar2 < 2) {
                pDVar4 = db->aDb;
                if (pTVar8->pSchema == (Schema *)0x0) {
                  iVar6 = -0x8000;
                }
                else {
                  iVar6 = -1;
                  ppSVar15 = &pDVar4->pSchema;
                  do {
                    iVar6 = iVar6 + 1;
                    pSVar5 = *ppSVar15;
                    ppSVar15 = ppSVar15 + 4;
                  } while (pSVar5 != pTVar8->pSchema);
                }
                zArg3 = pDVar4[iVar6].zDbSName;
                zArg3_00 = zArg3;
                if (isTemp != 0) {
                  zArg3_00 = pDVar4[1].zDbSName;
                }
                iVar7 = 5;
                if (isTemp == 0) {
                  iVar7 = (iVar6 != 1) + 5 + (uint)(iVar6 != 1);
                }
                iVar7 = sqlite3AuthCheck(pParse,iVar7,pcVar9,pcVar14,zArg3_00);
                if (iVar7 == 0) {
                  pcVar14 = "sqlite_master";
                  if (iVar6 == 1) {
                    pcVar14 = "sqlite_temp_master";
                  }
                  iVar6 = sqlite3AuthCheck(pParse,0x12,pcVar14,(char *)0x0,zArg3);
                  if (iVar6 == 0) goto LAB_00168b2c;
                }
              }
              else {
LAB_00168b2c:
                pTrigger = (Trigger *)sqlite3DbMallocZero(db,0x48);
                if (pTrigger != (Trigger *)0x0) {
                  pTrigger->zName = pcVar9;
                  pcVar9 = sqlite3DbStrDup(db,pTableName->a[0].zName);
                  pTrigger->table = pcVar9;
                  pTrigger->pSchema = db->aDb[iDb].pSchema;
                  pTrigger->pTabSchema = pTVar8->pSchema;
                  pTrigger->op = (u8)op;
                  pTrigger->tr_tm = '\x02' - ((tr_tm - 0x21U & 0xffffffdf) == 0);
                  if (pParse->eParseMode < 2) {
                    if (pWhen == (Expr *)0x0) {
                      pEVar11 = (Expr *)0x0;
                    }
                    else {
                      pEVar11 = exprDup(db,pWhen,1,(EdupBuf *)0x0);
                    }
                  }
                  else {
                    pRVar12 = pParse->pRename;
                    if (pRVar12 != (RenameToken *)0x0) {
                      do {
                        if ((char *)pRVar12->p == pTableName->a[0].zName) {
                          pRVar12->p = pcVar9;
                          break;
                        }
                        pRVar12 = pRVar12->pNext;
                      } while (pRVar12 != (RenameToken *)0x0);
                    }
                    pEVar11 = pWhen;
                    pWhen = (Expr *)0x0;
                  }
                  pTrigger->pWhen = pEVar11;
                  pTrigger->pColumns = pColumns;
                  pParse->pNewTrigger = pTrigger;
                  pColumns = (IdList *)0x0;
                  goto LAB_001687d0;
                }
              }
              goto LAB_0016894c;
            }
LAB_00168951:
            sqlite3DbFreeNN(db,pcVar9);
          }
          pTrigger = (Trigger *)0x0;
          goto LAB_001687d0;
        }
      }
    }
  }
  else if (pName2->n == 0) {
    iDb = 1;
    local_120 = pName1;
    if (pTableName != (SrcList *)0x0) goto LAB_0016873d;
  }
  else {
    sqlite3ErrorMsg(pParse,"temporary trigger may not have qualified name");
  }
  pTrigger = (Trigger *)0x0;
LAB_001687d0:
  sqlite3SrcListDelete(db,pTableName);
  sqlite3IdListDelete(db,pColumns);
  if (pWhen != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pWhen);
  }
  if (pParse->pNewTrigger == (Trigger *)0x0) {
    sqlite3DeleteTrigger(db,pTrigger);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BeginTrigger(
  Parse *pParse,      /* The parse context of the CREATE TRIGGER statement */
  Token *pName1,      /* The name of the trigger */
  Token *pName2,      /* The name of the trigger */
  int tr_tm,          /* One of TK_BEFORE, TK_AFTER, TK_INSTEAD */
  int op,             /* One of TK_INSERT, TK_UPDATE, TK_DELETE */
  IdList *pColumns,   /* column list if this is an UPDATE OF trigger */
  SrcList *pTableName,/* The name of the table/view the trigger applies to */
  Expr *pWhen,        /* WHEN clause */
  int isTemp,         /* True if the TEMPORARY keyword is present */
  int noErr           /* Suppress errors if the trigger already exists */
){
  Trigger *pTrigger = 0;  /* The new trigger */
  Table *pTab;            /* Table that the trigger fires off of */
  char *zName = 0;        /* Name of the trigger */
  sqlite3 *db = pParse->db;  /* The database connection */
  int iDb;                /* The database to store the trigger in */
  Token *pName;           /* The unqualified db name */
  DbFixer sFix;           /* State vector for the DB fixer */

  assert( pName1!=0 );   /* pName1->z might be NULL, but not pName1 itself */
  assert( pName2!=0 );
  assert( op==TK_INSERT || op==TK_UPDATE || op==TK_DELETE );
  assert( op>0 && op<0xff );
  if( isTemp ){
    /* If TEMP was specified, then the trigger name may not be qualified. */
    if( pName2->n>0 ){
      sqlite3ErrorMsg(pParse, "temporary trigger may not have qualified name");
      goto trigger_cleanup;
    }
    iDb = 1;
    pName = pName1;
  }else{
    /* Figure out the db that the trigger will be created in */
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ){
      goto trigger_cleanup;
    }
  }
  if( !pTableName || db->mallocFailed ){
    goto trigger_cleanup;
  }

  /* A long-standing parser bug is that this syntax was allowed:
  **
  **    CREATE TRIGGER attached.demo AFTER INSERT ON attached.tab ....
  **                                                 ^^^^^^^^
  **
  ** To maintain backwards compatibility, ignore the database
  ** name on pTableName if we are reparsing out of the schema table
  */
  if( db->init.busy && iDb!=1 ){
    sqlite3DbFree(db, pTableName->a[0].zDatabase);
    pTableName->a[0].zDatabase = 0;
  }

  /* If the trigger name was unqualified, and the table is a temp table,
  ** then set iDb to 1 to create the trigger in the temporary database.
  ** If sqlite3SrcListLookup() returns 0, indicating the table does not
  ** exist, the error is caught by the block below.
  */
  pTab = sqlite3SrcListLookup(pParse, pTableName);
  if( db->init.busy==0 && pName2->n==0 && pTab
        && pTab->pSchema==db->aDb[1].pSchema ){
    iDb = 1;
  }

  /* Ensure the table name matches database name and that the table exists */
  if( db->mallocFailed ) goto trigger_cleanup;
  assert( pTableName->nSrc==1 );
  sqlite3FixInit(&sFix, pParse, iDb, "trigger", pName);
  if( sqlite3FixSrcList(&sFix, pTableName) ){
    goto trigger_cleanup;
  }
  pTab = sqlite3SrcListLookup(pParse, pTableName);
  if( !pTab ){
    /* The table does not exist. */
    goto trigger_orphan_error;
  }
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "cannot create triggers on virtual tables");
    goto trigger_orphan_error;
  }
  if( (pTab->tabFlags & TF_Shadow)!=0 && sqlite3ReadOnlyShadowTables(db) ){
    sqlite3ErrorMsg(pParse, "cannot create triggers on shadow tables");
    goto trigger_orphan_error;
  }

  /* Check that the trigger name is not reserved and that no trigger of the
  ** specified name exists */
  zName = sqlite3NameFromToken(db, pName);
  if( zName==0 ){
    assert( db->mallocFailed );
    goto trigger_cleanup;
  }
  if( sqlite3CheckObjectName(pParse, zName, "trigger", pTab->zName) ){
    goto trigger_cleanup;
  }
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  if( !IN_RENAME_OBJECT ){
    if( sqlite3HashFind(&(db->aDb[iDb].pSchema->trigHash),zName) ){
      if( !noErr ){
        sqlite3ErrorMsg(pParse, "trigger %T already exists", pName);
      }else{
        assert( !db->init.busy );
        sqlite3CodeVerifySchema(pParse, iDb);
        VVA_ONLY( pParse->ifNotExists = 1; )
      }
      goto trigger_cleanup;
    }
  }

  /* Do not create a trigger on a system table */
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 ){
    sqlite3ErrorMsg(pParse, "cannot create trigger on system table");
    goto trigger_cleanup;
  }

  /* INSTEAD of triggers are only for views and views only support INSTEAD
  ** of triggers.
  */
  if( IsView(pTab) && tr_tm!=TK_INSTEAD ){
    sqlite3ErrorMsg(pParse, "cannot create %s trigger on view: %S",
        (tr_tm == TK_BEFORE)?"BEFORE":"AFTER", pTableName->a);
    goto trigger_orphan_error;
  }
  if( !IsView(pTab) && tr_tm==TK_INSTEAD ){
    sqlite3ErrorMsg(pParse, "cannot create INSTEAD OF"
        " trigger on table: %S", pTableName->a);
    goto trigger_orphan_error;
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  if( !IN_RENAME_OBJECT ){
    int iTabDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    int code = SQLITE_CREATE_TRIGGER;
    const char *zDb = db->aDb[iTabDb].zDbSName;
    const char *zDbTrig = isTemp ? db->aDb[1].zDbSName : zDb;
    if( iTabDb==1 || isTemp ) code = SQLITE_CREATE_TEMP_TRIGGER;
    if( sqlite3AuthCheck(pParse, code, zName, pTab->zName, zDbTrig) ){
      goto trigger_cleanup;
    }
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(iTabDb),0,zDb)){
      goto trigger_cleanup;
    }
  }
#endif

  /* INSTEAD OF triggers can only appear on views and BEFORE triggers
  ** cannot appear on views.  So we might as well translate every
  ** INSTEAD OF trigger into a BEFORE trigger.  It simplifies code
  ** elsewhere.
  */
  if (tr_tm == TK_INSTEAD){
    tr_tm = TK_BEFORE;
  }

  /* Build the Trigger object */
  pTrigger = (Trigger*)sqlite3DbMallocZero(db, sizeof(Trigger));
  if( pTrigger==0 ) goto trigger_cleanup;
  pTrigger->zName = zName;
  zName = 0;
  pTrigger->table = sqlite3DbStrDup(db, pTableName->a[0].zName);
  pTrigger->pSchema = db->aDb[iDb].pSchema;
  pTrigger->pTabSchema = pTab->pSchema;
  pTrigger->op = (u8)op;
  pTrigger->tr_tm = tr_tm==TK_BEFORE ? TRIGGER_BEFORE : TRIGGER_AFTER;
  if( IN_RENAME_OBJECT ){
    sqlite3RenameTokenRemap(pParse, pTrigger->table, pTableName->a[0].zName);
    pTrigger->pWhen = pWhen;
    pWhen = 0;
  }else{
    pTrigger->pWhen = sqlite3ExprDup(db, pWhen, EXPRDUP_REDUCE);
  }
  pTrigger->pColumns = pColumns;
  pColumns = 0;
  assert( pParse->pNewTrigger==0 );
  pParse->pNewTrigger = pTrigger;

trigger_cleanup:
  sqlite3DbFree(db, zName);
  sqlite3SrcListDelete(db, pTableName);
  sqlite3IdListDelete(db, pColumns);
  sqlite3ExprDelete(db, pWhen);
  if( !pParse->pNewTrigger ){
    sqlite3DeleteTrigger(db, pTrigger);
  }else{
    assert( pParse->pNewTrigger==pTrigger );
  }
  return;

trigger_orphan_error:
  if( db->init.iDb==1 ){
    /* Ticket #3810.
    ** Normally, whenever a table is dropped, all associated triggers are
    ** dropped too.  But if a TEMP trigger is created on a non-TEMP table
    ** and the table is dropped by a different database connection, the
    ** trigger is not visible to the database connection that does the
    ** drop so the trigger cannot be dropped.  This results in an
    ** "orphaned trigger" - a trigger whose associated table is missing.
    **
    ** 2020-11-05 see also https://sqlite.org/forum/forumpost/157dc791df
    */
    db->init.orphanTrigger = 1;
  }
  goto trigger_cleanup;
}